

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLoader.cpp
# Opt level: O1

void __thiscall COLLADASaxFWL::Loader::~Loader(Loader *this)

{
  pointer ppMVar1;
  pointer ppCVar2;
  pointer ppLVar3;
  pointer ppEVar4;
  pointer ppLVar5;
  pointer ppVVar6;
  pointer ppIVar7;
  _Rb_tree_node_base *p_Var8;
  
  (this->super_ILoader)._vptr_ILoader = (_func_int **)&PTR__Loader_00928e20;
  if (this->mSidTreeRoot != (SidTreeNode *)0x0) {
    (*this->mSidTreeRoot->_vptr_SidTreeNode[1])();
  }
  deleteVectorFW<COLLADAFW::VisualScene*>(&this->mVisualScenes);
  deleteVectorFW<COLLADAFW::LibraryNodes*>(&this->mLibraryNodes);
  deleteVectorFW<COLLADAFW::Effect*>(&this->mEffects);
  deleteVectorFW<COLLADAFW::Light*>(&this->mLights);
  deleteVectorFW<COLLADAFW::Camera*>(&this->mCameras);
  for (p_Var8 = (this->mUniqueIdAnimationListMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var8 !=
      &(this->mUniqueIdAnimationListMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    if (p_Var8[1]._M_right != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var8[1]._M_right + 8))();
    }
  }
  std::
  vector<COLLADASaxFWL::Loader::AnimationSidAddressBinding,_std::allocator<COLLADASaxFWL::Loader::AnimationSidAddressBinding>_>
  ::~vector(&this->mAnimationSidAddressBindings);
  std::
  _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
  ::~_Rb_tree(&(this->mFormulasMap)._M_t);
  KinematicsIntermediateData::~KinematicsIntermediateData(&this->mKinematicsIntermediateData);
  std::
  _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>_>
  ::~_Rb_tree(&(this->mUniqueIdAnimationListMap)._M_t);
  std::
  _Rb_tree<COLLADAFW::SkinController,_COLLADAFW::SkinController,_std::_Identity<COLLADAFW::SkinController>,_bool_(*)(const_COLLADAFW::SkinController_&,_const_COLLADAFW::SkinController_&),_std::allocator<COLLADAFW::SkinController>_>
  ::~_Rb_tree(&(this->mSkinControllerSet)._M_t);
  std::
  _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_COLLADABU::URI>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_COLLADABU::URI>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADABU::URI>_>_>
  ::~_Rb_tree(&(this->mSkinDataSkinSourceMap)._M_t);
  std::
  _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_std::__cxx11::list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>_>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_std::__cxx11::list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>_>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_std::__cxx11::list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>_>_>_>
  ::~_Rb_tree(&(this->mInstanceControllerDataListMap)._M_t);
  std::
  _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_COLLADASaxFWL::Loader::JointSidsOrIds>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_COLLADASaxFWL::Loader::JointSidsOrIds>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADASaxFWL::Loader::JointSidsOrIds>_>_>
  ::~_Rb_tree(&(this->mSkinDataJointSidsMap)._M_t);
  ppMVar1 = (this->mMorphControllerList).
            super__Vector_base<COLLADAFW::MorphController_*,_std::allocator<COLLADAFW::MorphController_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar1 != (pointer)0x0) {
    operator_delete(ppMVar1,(long)(this->mMorphControllerList).
                                  super__Vector_base<COLLADAFW::MorphController_*,_std::allocator<COLLADAFW::MorphController_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar1
                   );
  }
  ppCVar2 = (this->mCameras).
            super__Vector_base<COLLADAFW::Camera_*,_std::allocator<COLLADAFW::Camera_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->mCameras).
                                  super__Vector_base<COLLADAFW::Camera_*,_std::allocator<COLLADAFW::Camera_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
  }
  ppLVar3 = (this->mLights).
            super__Vector_base<COLLADAFW::Light_*,_std::allocator<COLLADAFW::Light_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppLVar3 != (pointer)0x0) {
    operator_delete(ppLVar3,(long)(this->mLights).
                                  super__Vector_base<COLLADAFW::Light_*,_std::allocator<COLLADAFW::Light_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar3
                   );
  }
  ppEVar4 = (this->mEffects).
            super__Vector_base<COLLADAFW::Effect_*,_std::allocator<COLLADAFW::Effect_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar4 != (pointer)0x0) {
    operator_delete(ppEVar4,(long)(this->mEffects).
                                  super__Vector_base<COLLADAFW::Effect_*,_std::allocator<COLLADAFW::Effect_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar4
                   );
  }
  ppLVar5 = (this->mLibraryNodes).
            super__Vector_base<COLLADAFW::LibraryNodes_*,_std::allocator<COLLADAFW::LibraryNodes_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppLVar5 != (pointer)0x0) {
    operator_delete(ppLVar5,(long)(this->mLibraryNodes).
                                  super__Vector_base<COLLADAFW::LibraryNodes_*,_std::allocator<COLLADAFW::LibraryNodes_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar5
                   );
  }
  ppVVar6 = (this->mVisualScenes).
            super__Vector_base<COLLADAFW::VisualScene_*,_std::allocator<COLLADAFW::VisualScene_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppVVar6 != (pointer)0x0) {
    operator_delete(ppVVar6,(long)(this->mVisualScenes).
                                  super__Vector_base<COLLADAFW::VisualScene_*,_std::allocator<COLLADAFW::VisualScene_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar6
                   );
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>_>_>
  ::~_Rb_tree(&(this->mIdStringSidTreeNodeMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mTextureMapSemanticTextureMapIdMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mGeometryMaterialIdInfo).mColladaSymbolMaterialIdMap._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_COLLADABU::URI>,_std::_Select1st<std::pair<const_unsigned_long,_COLLADABU::URI>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_COLLADABU::URI>_>_>
  ::~_Rb_tree(&(this->mFileIdURIMap)._M_t);
  std::tr1::
  _Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_unsigned_long>,_std::allocator<std::pair<const_COLLADABU::URI,_unsigned_long>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_unsigned_long>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  ::~_Hashtable((_Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_unsigned_long>,_std::allocator<std::pair<const_COLLADABU::URI,_unsigned_long>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_unsigned_long>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                 *)&this->mURIFileIdMap);
  std::tr1::
  _Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  ::~_Hashtable((_Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADAFW::UniqueId>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                 *)&this->mURIUniqueIdMap);
  ppIVar7 = (this->mExtraDataCallbackHandlerList).
            super__Vector_base<COLLADASaxFWL::IExtraDataCallbackHandler_*,_std::allocator<COLLADASaxFWL::IExtraDataCallbackHandler_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar7 != (pointer)0x0) {
    operator_delete(ppIVar7,(long)(this->mExtraDataCallbackHandlerList).
                                  super__Vector_base<COLLADASaxFWL::IExtraDataCallbackHandler_*,_std::allocator<COLLADASaxFWL::IExtraDataCallbackHandler_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar7
                   );
  }
  COLLADAFW::LoaderUtils::~LoaderUtils(&this->mLoaderUtil);
  return;
}

Assistant:

Loader::~Loader()
	{
		delete mSidTreeRoot;

		// delete visual scenes
		deleteVectorFW(mVisualScenes);

		// delete library nodes
		deleteVectorFW(mLibraryNodes);

		// delete effects
		deleteVectorFW(mEffects);

		// delete lights
		deleteVectorFW(mLights);

		// delete cameras
		deleteVectorFW(mCameras);

		// We do not delete formulas here. They are deleted by the Formulas class

		// delete animation lists
		Loader::UniqueIdAnimationListMap::const_iterator it = mUniqueIdAnimationListMap.begin();
		for ( ; it != mUniqueIdAnimationListMap.end(); ++it )
		{
			COLLADAFW::AnimationList* animationList = it->second;
			FW_DELETE animationList;
		}
	}